

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

void duckdb::TimeBucketFunction<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  reference left;
  reference right;
  long lVar1;
  idx_t count;
  ulong uVar2;
  int iVar3;
  code *fun;
  interval_t local_30;
  
  left = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  right = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  if (*left != (value_type)0x2) {
    BinaryExecutor::
    ExecuteSwitch<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::BinaryLambdaWrapper,bool,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t)>
              (left,right,result,*(idx_t *)(args + 0x18),
               TimeBucket::BinaryOperator::
               Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>);
    return;
  }
  if ((*(byte **)(left + 0x28) != (byte *)0x0) && ((**(byte **)(left + 0x28) & 1) == 0)) {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::ConstantVector::SetNull(result,true);
    return;
  }
  uVar2 = **(ulong **)(left + 0x20);
  local_30.micros = (*(ulong **)(left + 0x20))[1];
  local_30._0_8_ = uVar2;
  if ((int)uVar2 == 0) {
    lVar1 = duckdb::Interval::GetMicro(&local_30);
    if (0 < lVar1) {
      count = *(idx_t *)(args + 0x18);
      fun = TimeBucket::WidthConvertibleToMicrosBinaryOperator::
            Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>;
      goto LAB_005adcc1;
    }
    uVar2 = local_30._0_8_ & 0xffffffff;
    iVar3 = local_30.days;
  }
  else {
    iVar3 = (int)(uVar2 >> 0x20);
  }
  count = *(idx_t *)(args + 0x18);
  if ((((int)uVar2 < 1) || (iVar3 != 0)) || (local_30.micros != 0)) {
    fun = TimeBucket::BinaryOperator::
          Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>;
  }
  else {
    fun = TimeBucket::WidthConvertibleToMonthsBinaryOperator::
          Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>;
  }
LAB_005adcc1:
  BinaryExecutor::
  ExecuteSwitch<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::BinaryLambdaWrapper,bool,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t)>
            (left,right,result,count,fun);
  return;
}

Assistant:

static void TimeBucketFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);

	auto &bucket_width_arg = args.data[0];
	auto &ts_arg = args.data[1];

	if (bucket_width_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		if (ConstantVector::IsNull(bucket_width_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			interval_t bucket_width = *ConstantVector::GetData<interval_t>(bucket_width_arg);
			TimeBucket::BucketWidthType bucket_width_type = TimeBucket::ClassifyBucketWidth(bucket_width);
			switch (bucket_width_type) {
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MICROS:
				BinaryExecutor::Execute<interval_t, T, T>(
				    bucket_width_arg, ts_arg, result, args.size(),
				    TimeBucket::WidthConvertibleToMicrosBinaryOperator::Operation<interval_t, T, T>);
				break;
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MONTHS:
				BinaryExecutor::Execute<interval_t, T, T>(
				    bucket_width_arg, ts_arg, result, args.size(),
				    TimeBucket::WidthConvertibleToMonthsBinaryOperator::Operation<interval_t, T, T>);
				break;
			case TimeBucket::BucketWidthType::UNCLASSIFIED:
				BinaryExecutor::Execute<interval_t, T, T>(bucket_width_arg, ts_arg, result, args.size(),
				                                          TimeBucket::BinaryOperator::Operation<interval_t, T, T>);
				break;
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}
	} else {
		BinaryExecutor::Execute<interval_t, T, T>(bucket_width_arg, ts_arg, result, args.size(),
		                                          TimeBucket::BinaryOperator::Operation<interval_t, T, T>);
	}
}